

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintParagraph(cmDocumentationFormatter *this,ostream *os,char *text)

{
  std::operator<<(os,this->TextIndent);
  PrintColumn(this,os,text);
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintParagraph(std::ostream& os,
                                              const char* text)
{
  os << this->TextIndent;
  this->PrintColumn(os, text);
  os << "\n";
}